

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

bool benchmarkMany8(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                   pospopcnt_u8_method_type fn,bool verbose,bool test,bool tabular)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  result_type rVar6;
  int iVar7;
  undefined8 extraout_RAX;
  pointer pvVar8;
  byte bVar9;
  ulong uVar10;
  size_t k2;
  ulong uVar11;
  pointer puVar12;
  long lVar13;
  char *__format;
  undefined7 in_register_00000089;
  ulong uVar14;
  long lVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *x;
  pointer pvVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  pospopcnt_u8_method_type p_Var20;
  undefined1 auVar21 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_ZMM2 [64];
  undefined1 auVar23 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  allocator_type local_2975;
  uint32_t local_2974;
  byte local_2970;
  undefined3 uStack_296f;
  allocator_type local_2969;
  ulong local_2968;
  double local_2960;
  pospopcnt_u8_method_type local_2958;
  undefined4 local_294c;
  uint32_t local_2948;
  uint32_t local_2944;
  double local_2940;
  vector<int,_std::allocator<int>_> evts;
  vector<double,_std::allocator<double>_> avg;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vdata;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2868;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2850;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2838;
  _Vector_base<int,_std::allocator<int>_> local_2820;
  uniform_int_distribution<int> dis;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  undefined1 auVar22 [64];
  
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_294c = (undefined4)CONCAT71(in_register_00000089,verbose);
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_2958 = fn;
  local_2948 = n;
  local_2944 = iterations;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rd,(ulong)n,
             (allocator_type *)&gen);
  uVar10 = (ulong)m;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&vdata,uVar10,(value_type *)&rd,(allocator_type *)&unified);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rd);
  if ((char)local_294c == '\x01' && !tabular) {
    printf("alignments: ");
    pvVar8 = vdata.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar16 = vdata.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar16 != pvVar8;
        pvVar16 = pvVar16 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar16->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar16->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  rd.field_0._M_mt._M_x[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  rd.field_0._M_mt._M_x[0]._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&evts,(int *)&rd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2820,&evts);
  LinuxEvents<0>::LinuxEvents(&unified,(vector<int,_std::allocator<int>_> *)&local_2820);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2820);
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allresults.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            (&results,(long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)evts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device(&rd);
  local_2974 = m;
  uVar5 = std::random_device::_M_getval();
  auVar22._8_56_ = extraout_var;
  auVar22._0_8_ = extraout_XMM1_Qa;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar5);
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0xff;
  local_2970 = 1;
  uStack_296f = 0;
  dVar19 = 0.0;
  local_2940 = (double)CONCAT71(local_2940._1_7_,!test);
  do {
    auVar23 = in_ZMM3._0_16_;
    auVar21 = auVar22._0_16_;
    auVar17 = in_ZMM2._0_16_;
    if (SUB84(dVar19,0) == local_2944) {
      uVar5 = 0;
      for (puVar12 = times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar12 !=
          times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar12 = puVar12 + 1) {
        uVar5 = uVar5 + *puVar12;
      }
      lVar15 = (long)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2838,&allresults);
      compute_mins(&mins,&local_2838);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2838);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::vector(&local_2850,&allresults);
      compute_averages(&avg,&local_2850);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::~vector(&local_2850);
      auVar18 = vcvtusi2sd_avx512f(auVar21,local_2948);
      local_2940 = auVar18._0_8_ * 9.5367431640625e-07;
      if (tabular) {
        uVar10 = (ulong)local_2944;
        lVar15 = 0;
        uVar14 = 0;
        auVar21 = vcvtusi2sd_avx512f(auVar21,local_2974 * local_2948);
        local_2960 = auVar21._0_8_;
        for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          auVar21 = vcvtusi2sd_avx512f(in_ZMM4._0_16_,
                                       times.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar14]);
          local_2958 = (pospopcnt_u8_method_type)(local_2940 / (auVar21._0_8_ / 1000000000.0));
          printf("%s\t%u\t%d\t",(fn_name->_M_dataplus)._M_p,(ulong)local_2948,uVar14 & 0xffffffff);
          auVar17 = vcvtuqq2pd_avx512vl(**(undefined1 (**) [16])
                                          ((long)&((allresults.
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          lVar15));
          auVar21 = vshufpd_avx(auVar17,auVar17,1);
          printf("%4.2f\t%4.3f\t%4.3f\t",auVar21._0_8_ / auVar17._0_8_,auVar17._0_8_ / local_2960,
                 auVar21._0_8_ / local_2960);
          puVar4 = *(undefined8 **)
                    ((long)&((allresults.
                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar15);
          printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar4,puVar4[1],puVar4[2],puVar4[3],puVar4[4]);
          printf("%u\t%4.2f\n",local_2958,
                 (ulong)times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14]);
          lVar15 = lVar15 + 0x18;
        }
      }
      else {
        if ((char)local_294c == '\0') {
          auVar23 = vcvtusi2sd_avx512f(auVar21,*mins.
                                                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
          __format = "cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n";
          auVar21 = vcvtusi2sd_avx512f(auVar21,local_2974 * local_2948);
          dVar19 = auVar23._0_8_ / auVar21._0_8_;
          auVar17 = vcvtusi2sd_avx512f(auVar17,mins.
                                               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start[5]);
          p_Var20 = (pospopcnt_u8_method_type)(auVar17._0_8_ / auVar21._0_8_);
        }
        else {
          local_2960 = (double)((ulong)uVar5 / (ulong)(lVar15 >> 2));
          local_2958 = (pospopcnt_u8_method_type)(local_2940 / (local_2960 / 1000000000.0));
          auVar18 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                         mins.
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          auVar21 = vshufpd_avx(auVar18,auVar18,1);
          auVar17 = vcvtusi2sd_avx512f(auVar23,local_2974 * local_2948);
          printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, instructions per 8-bit word %4.3f \n"
                 ,auVar21._0_8_ / auVar18._0_8_,auVar18._0_8_ / auVar17._0_8_,
                 auVar21._0_8_ / auVar17._0_8_);
          printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
                 ,*mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[1],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[2],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[3],
                 mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[4]);
          printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
                 ,*avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[2],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[3],
                 avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[4]);
          __format = "avg time: %f ns, %4.2f mb/s\n";
          dVar19 = local_2960;
          p_Var20 = local_2958;
        }
        printf(__format,dVar19,p_Var20);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&avg.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                (&mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
      bVar9 = local_2970;
      goto LAB_00119ada;
    }
    pvVar8 = vdata.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2960 = dVar19;
    for (uVar14 = 0;
        uVar14 < (ulong)(((long)vdata.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0x18);
        uVar14 = uVar14 + 1) {
      for (uVar11 = 0;
          uVar11 < (ulong)((long)pvVar8[uVar14].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)pvVar8[uVar14].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start); uVar11 = uVar11 + 1) {
        rVar6 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
        vdata.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar14].
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = (uchar)rVar6;
        pvVar8 = vdata.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&avg,8,
               (allocator_type *)&local_2868);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&mins,uVar10,(value_type *)&avg,&local_2975);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&avg);
    for (lVar15 = 0; uVar10 * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
      puVar3 = *(uint8_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar15);
      pospopcnt_u8_scalar_naive
                (puVar3,*(long *)((long)&((vdata.
                                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + lVar15) -
                        (long)puVar3,
                 *(uint32_t **)
                  ((long)mins.
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2868,8,
               (allocator_type *)&local_2975);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&avg,uVar10,(value_type *)&local_2868,&local_2969);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2868);
    local_2968 = std::chrono::_V2::system_clock::now();
    LinuxEvents<0>::start(&unified);
    for (lVar15 = 0; uVar10 * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
      puVar3 = *(uint8_t **)
                ((long)&((vdata.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar15);
      (*local_2958)(puVar3,*(long *)((long)&((vdata.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_finish + lVar15) -
                           (long)puVar3,
                    *(uint32_t **)
                     ((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar15));
    }
    LinuxEvents<0>::end(&unified,&results);
    iVar7 = std::chrono::_V2::system_clock::now();
    auVar22._8_56_ = extraout_var_00;
    auVar22._0_8_ = extraout_XMM1_Qa_00;
    lVar15 = 0;
    for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
      for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
        lVar15 = lVar15 + (ulong)*(uint *)((long)avg.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [uVar14 * 3] + lVar13 * 4);
      }
    }
    if (lVar15 == 0) {
      local_2968 = local_2968 & 0xffffffff00000000;
    }
    else {
      for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          iVar1 = *(int *)(mins.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14 * 3] + lVar15 * 4);
          iVar2 = *(int *)((long)avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar14 * 3] + lVar15 * 4);
          if (iVar1 != iVar2 && local_2940._0_1_ == '\0') {
            puts("bug:");
            local_2968 = local_2968 & 0xffffffff00000000;
            printf("expected : ");
            print16((uint32_t *)
                    mins.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14 * 3]);
            printf("got      : ");
            print16((uint32_t *)
                    avg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14 * 3]);
            goto LAB_00119784;
          }
          local_2970 = local_2970 & iVar1 == iVar2;
        }
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back(&allresults,&results);
      local_2868._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar7 - (int)local_2968;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&times,(uint *)&local_2868);
      local_2968 = CONCAT44(local_2968._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
    }
LAB_00119784:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&avg);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&mins);
    dVar19 = (double)(ulong)(SUB84(local_2960,0) + 1);
  } while ((char)local_2968 != '\0');
  bVar9 = 0;
LAB_00119ada:
  std::random_device::~random_device(&rd);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&allresults);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&results.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  LinuxEvents<0>::~LinuxEvents(&unified);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&vdata);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&evts.super__Vector_base<int,_std::allocator<int>_>);
  return (bool)(bVar9 & 1);
}

Assistant:

bool benchmarkMany8(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u8_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>> vdata(m, std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>(n));
#else
    std::vector<std::vector<uint8_t>> vdata(m, std::vector<uint8_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(8));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u8_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(8));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 8; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 8; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = (n / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = (n / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, "
               "instructions per 8-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}